

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

void __thiscall sptk::reaper::EpochTracker::GetResidualPulses(EpochTracker *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  size_type sVar9;
  vector<float,_std::allocator<float>_> *this_00;
  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
  *pvVar10;
  reference pvVar11;
  size_type in_RDI;
  ResidPeak *this_01;
  float time;
  ResidPeak p;
  float skew;
  float sharp;
  float vp_skew;
  float vm_skew;
  float vp_peak;
  float vm_peak;
  float val;
  int32_t i_1;
  size_t i;
  int32_t limit;
  float min_peak;
  int32_t skew_ind;
  int32_t peak_ind;
  float fVar12;
  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
  *this_02;
  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
  *in_stack_ffffffffffffff30;
  value_type local_a8;
  int local_24;
  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
  *local_20;
  
  iVar6 = RoundUp(*(float *)(in_RDI + 400) * *(float *)(in_RDI + 0x128));
  iVar7 = RoundUp(*(float *)(in_RDI + 0x194) * *(float *)(in_RDI + 0x128));
  sVar9 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x68));
  std::
  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
  ::resize(in_stack_ffffffffffffff30,in_RDI);
  this_00 = (vector<float,_std::allocator<float>_> *)(in_RDI + 0x80);
  std::vector<float,_std::allocator<float>_>::size
            ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x50));
  std::vector<float,_std::allocator<float>_>::resize(this_00,in_RDI);
  local_20 = (vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
              *)0x0;
  while (this_02 = local_20,
        pvVar10 = (vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                   *)std::vector<float,_std::allocator<float>_>::size
                               ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x80)),
        local_24 = iVar6, this_02 < pvVar10) {
    pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x80),
                         (size_type)local_20);
    *pvVar11 = 0.0;
    local_20 = (vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                *)((long)&(local_20->
                          super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  for (; local_24 < (int)sVar9 - iVar6; local_24 = local_24 + 1) {
    pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x68),(long)local_24);
    fVar1 = *pvVar11;
    if (((fVar1 <= -1.0) &&
        (pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x68),
                              (long)(local_24 + -1)), fVar1 < *pvVar11)) &&
       (fVar12 = fVar1,
       pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x68),
                            (long)(local_24 + 1)), fVar12 <= *pvVar11)) {
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x68),
                           (long)(local_24 - iVar6));
      fVar2 = *pvVar11;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x68),
                           (long)(local_24 + iVar6));
      fVar3 = *pvVar11;
      if ((fVar1 <= fVar2) && (fVar1 <= fVar3)) {
        this_01 = (ResidPeak *)(in_RDI + 0x68);
        pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)this_01,
                             (long)(local_24 - iVar7));
        fVar4 = *pvVar11;
        pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)this_01,
                             (long)(local_24 + iVar7));
        fVar5 = *pvVar11;
        ResidPeak::ResidPeak(this_01);
        iVar8 = RoundUp(((float)local_24 / *(float *)(in_RDI + 0x128)) / *(float *)(in_RDI + 0x174))
        ;
        local_a8 = ((fVar3 + fVar2) * 0.5 - fVar1) * *(float *)(in_RDI + 0x19c) +
                   -fVar1 * *(float *)(in_RDI + 0x198) +
                   -(fVar4 - fVar5) * *(float *)(in_RDI + 0x1a0);
        if (local_a8 < *(float *)(in_RDI + 0x1a4)) {
          local_a8 = *(value_type *)(in_RDI + 0x1a4);
        }
        std::
        vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
        ::push_back(this_02,(value_type *)CONCAT44(fVar12,iVar8));
        pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x80),(long)local_24
                            );
        *pvVar11 = local_a8;
        ResidPeak::~ResidPeak(this_01);
      }
    }
  }
  return;
}

Assistant:

void EpochTracker::GetResidualPulses(void) {
  int32_t peak_ind = RoundUp(peak_delay_ * sample_rate_);
  int32_t skew_ind = RoundUp(skew_delay_ * sample_rate_);
  float min_peak = -1.0;  // minimum value that will be considered as a peak
  int32_t limit = norm_residual_.size() - peak_ind;
  resid_peaks_.resize(0);
  peaks_debug_.resize(residual_.size());
  for (size_t i = 0; i < peaks_debug_.size(); ++i) {
    peaks_debug_[i] = 0.0;
  }
  for (int32_t i = peak_ind; i < limit; ++i) {
    float val = norm_residual_[i];
    if (val > min_peak) {
      continue;
    }
    if ((norm_residual_[i-1] > val) && (val <= norm_residual_[i+1])) {
      float vm_peak = norm_residual_[i - peak_ind];
      float vp_peak = norm_residual_[i + peak_ind];
      if ((vm_peak < val) || (vp_peak < val)) {
        continue;
      }
      float vm_skew = norm_residual_[i - skew_ind];
      float vp_skew = norm_residual_[i + skew_ind];
      float sharp = (0.5 * (vp_peak + vm_peak)) - val;
      float skew = -(vm_skew - vp_skew);
      ResidPeak p;
      p.resid_index = i;
      float time = static_cast<float>(i) / sample_rate_;
      p.frame_index = RoundUp(time / internal_frame_interval_);
      if (p.frame_index >= n_feature_frames_) {
        p.frame_index = n_feature_frames_ - 1;
      }
      p.peak_quality = (-val * peak_val_wt_) + (skew * peak_skew_wt_) +
          (sharp * peak_prominence_wt_);
      if (p.peak_quality < peak_quality_floor_) {
        p.peak_quality = peak_quality_floor_;
      }
      resid_peaks_.push_back(p);
      peaks_debug_[i] = p.peak_quality;
    }
  }
}